

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.hpp
# Opt level: O0

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)> *
__thiscall Kandinsky::Constant::toString_abi_cxx11_(Constant *this,bool param_2)

{
  double in_RSI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  *in_RDI;
  
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  ::operator()(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

virtual std::string toString(bool /*evaluate*/ = false) const
        {
            return m_formatter(m_value);
        }